

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpSuffixTreeToDotFile
          (GeneralizedSuffixTree *this,string *filename)

{
  FILE *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_21;
  
  puts("Dumping tree...");
  __s = fopen((filename->_M_dataplus)._M_p,"w");
  if (__s != (FILE *)0x0) {
    fwrite("digraph suffixtree\n{\n",0x15,1,__s);
    DumpNode(this,this->root,(FILE *)__s);
    fwrite("}\n",2,1,__s);
    fclose(__s);
    puts("Tree was dumped successfully");
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Can not open file: ",&local_21);
  std::operator+(__return_storage_ptr__,&local_48,filename);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void GeneralizedSuffixTree::DumpSuffixTreeToDotFile (std::string filename)
{
    printf ("Dumping tree...\n");
    FILE *file = fopen (filename.c_str(), "w");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    fprintf (file, "digraph suffixtree\n{\n");
    DumpNode (root, file);
    fprintf (file, "}\n");
    fclose (file);
    printf ("Tree was dumped successfully\n");
}